

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_parse_url_auth_option(SASL *sasl,char *value,size_t len)

{
  unsigned_short uVar1;
  int iVar2;
  size_t sStack_38;
  unsigned_short mechbit;
  size_t mechlen;
  size_t sStack_28;
  CURLcode result;
  size_t len_local;
  char *value_local;
  SASL *sasl_local;
  
  mechlen._4_4_ = CURLE_OK;
  if (len == 0) {
    sasl_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    if ((sasl->field_0x1e & 1) != 0) {
      sasl->field_0x1e = sasl->field_0x1e & 0xfe;
      sasl->prefmech = 0;
    }
    sStack_28 = len;
    len_local = (size_t)value;
    value_local = (char *)sasl;
    iVar2 = strncmp(value,"*",len);
    if (iVar2 == 0) {
      value_local[0x1a] = -0x21;
      value_local[0x1b] = -1;
    }
    else {
      uVar1 = Curl_sasl_decode_mech((char *)len_local,sStack_28,&stack0xffffffffffffffc8);
      if ((uVar1 == 0) || (sStack_38 != sStack_28)) {
        mechlen._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        *(ushort *)(value_local + 0x1a) = *(ushort *)(value_local + 0x1a) | uVar1;
      }
    }
    sasl_local._4_4_ = mechlen._4_4_;
  }
  return sasl_local._4_4_;
}

Assistant:

CURLcode Curl_sasl_parse_url_auth_option(struct SASL *sasl,
                                         const char *value, size_t len)
{
  CURLcode result = CURLE_OK;
  size_t mechlen;

  if(!len)
    return CURLE_URL_MALFORMAT;

  if(sasl->resetprefs) {
    sasl->resetprefs = FALSE;
    sasl->prefmech = SASL_AUTH_NONE;
  }

  if(!strncmp(value, "*", len))
    sasl->prefmech = SASL_AUTH_DEFAULT;
  else {
    unsigned short mechbit = Curl_sasl_decode_mech(value, len, &mechlen);
    if(mechbit && mechlen == len)
      sasl->prefmech |= mechbit;
    else
      result = CURLE_URL_MALFORMAT;
  }

  return result;
}